

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ltm.c
# Opt level: O0

int luaT_callorderTM(lua_State *L,TValue *p1,TValue *p2,TMS event)

{
  uint uVar1;
  bool local_29;
  int tag;
  TMS event_local;
  TValue *p2_local;
  TValue *p1_local;
  lua_State *L_local;
  
  uVar1 = callbinTM(L,p1,p2,(L->top).p,event);
  if (-1 < (int)uVar1) {
    local_29 = uVar1 == 1 || (uVar1 & 0xf) == 0;
    return (int)((local_29 ^ 0xffU) & 1);
  }
  luaG_ordererror(L,p1,p2);
}

Assistant:

int luaT_callorderTM (lua_State *L, const TValue *p1, const TValue *p2,
                      TMS event) {
  int tag = callbinTM(L, p1, p2, L->top.p, event);  /* try original event */
  if (tag >= 0)  /* found tag method? */
    return !tagisfalse(tag);
#if defined(LUA_COMPAT_LT_LE)
  else if (event == TM_LE) {
    /* try '!(p2 < p1)' for '(p1 <= p2)' */
    L->ci->callstatus |= CIST_LEQ;  /* mark it is doing 'lt' for 'le' */
    tag = callbinTM(L, p2, p1, L->top.p, TM_LT);
    L->ci->callstatus ^= CIST_LEQ;  /* clear mark */
    if (tag >= 0)  /* found tag method? */
      return tagisfalse(tag);
  }
#endif
  luaG_ordererror(L, p1, p2);  /* no metamethod found */
  return 0;  /* to avoid warnings */
}